

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::KurtosisState,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
               (double *idata,AggregateInputData *aggr_input_data,KurtosisState **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  KurtosisState *pKVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  double dVar9;
  double dVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar5 = 0;
      do {
        pKVar2 = states[iVar5];
        pKVar2->n = pKVar2->n + 1;
        dVar10 = idata[iVar5];
        pKVar2->sum = dVar10 + pKVar2->sum;
        pKVar2->sum_sqr = dVar10 * dVar10 + pKVar2->sum_sqr;
        dVar9 = pow(dVar10,3.0);
        pKVar2->sum_cub = dVar9 + pKVar2->sum_cub;
        dVar10 = pow(dVar10,4.0);
        pKVar2->sum_four = dVar10 + pKVar2->sum_four;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar6 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar1[uVar3];
      }
      uVar4 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar4 = count;
      }
      uVar7 = uVar4;
      if (uVar8 != 0) {
        uVar7 = uVar6;
        if (uVar8 == 0xffffffffffffffff) {
          if (uVar6 < uVar4) {
            do {
              pKVar2 = states[uVar7];
              pKVar2->n = pKVar2->n + 1;
              dVar10 = idata[uVar7];
              pKVar2->sum = dVar10 + pKVar2->sum;
              pKVar2->sum_sqr = dVar10 * dVar10 + pKVar2->sum_sqr;
              dVar9 = pow(dVar10,3.0);
              pKVar2->sum_cub = dVar9 + pKVar2->sum_cub;
              dVar10 = pow(dVar10,4.0);
              pKVar2->sum_four = dVar10 + pKVar2->sum_four;
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
        }
        else if (uVar6 < uVar4) {
          uVar7 = 0;
          do {
            if ((uVar8 >> (uVar7 & 0x3f) & 1) != 0) {
              pKVar2 = states[uVar6 + uVar7];
              pKVar2->n = pKVar2->n + 1;
              dVar10 = idata[uVar6 + uVar7];
              pKVar2->sum = dVar10 + pKVar2->sum;
              pKVar2->sum_sqr = dVar10 * dVar10 + pKVar2->sum_sqr;
              dVar9 = pow(dVar10,3.0);
              pKVar2->sum_cub = dVar9 + pKVar2->sum_cub;
              dVar10 = pow(dVar10,4.0);
              pKVar2->sum_four = dVar10 + pKVar2->sum_four;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar6 - uVar4) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      uVar3 = uVar3 + 1;
      uVar6 = uVar7;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}